

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

bool __thiscall QFontInfo::fixedPitch(QFontInfo *this)

{
  QFontEngine *pQVar1;
  int unaff_retaddr;
  QFontEngine *engine;
  
  QExplicitlySharedDataPointer<QFontPrivate>::operator->
            ((QExplicitlySharedDataPointer<QFontPrivate> *)0x717807);
  pQVar1 = QFontPrivate::engineForScript((QFontPrivate *)engine,unaff_retaddr);
  return (*(ulong *)&(pQVar1->fontDef).field_0x60 >> 0x32 & 1) != 0;
}

Assistant:

bool QFontInfo::fixedPitch() const
{
    QFontEngine *engine = d->engineForScript(QChar::Script_Common);
    Q_ASSERT(engine != nullptr);
#ifdef Q_OS_MAC
    if (!engine->fontDef.fixedPitchComputed) {
        QChar ch[2] = { u'i', u'm' };
        QGlyphLayoutArray<2> g;
        int l = 2;
        if (engine->stringToCMap(ch, 2, &g, &l, {}) < 0)
            Q_UNREACHABLE();
        Q_ASSERT(l == 2);
        engine->fontDef.fixedPitch = g.advances[0] == g.advances[1];
        engine->fontDef.fixedPitchComputed = true;
    }
#endif
    return engine->fontDef.fixedPitch;
}